

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char8_t *value)

{
  char8_t *pcVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar2;
  basic_string_view<char8_t> value_00;
  char8_t *value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_local;
  
  if (value == (char8_t *)0x0) {
    fmt::v8::detail::throw_format_error("string pointer is null");
  }
  pcVar1 = (char8_t *)std::char_traits<char8_t>::length(value);
  value_00.size_ = (size_t)pcVar1;
  value_00.data_ = pcVar1;
  bVar2 = write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                    (out.container,(back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)value,
                     value_00);
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}